

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

void __thiscall
google::protobuf::io::CodedOutputStream::WriteAliasedRaw
          (CodedOutputStream *this,void *data,int size)

{
  int iVar1;
  int size_local;
  void *data_local;
  CodedOutputStream *this_local;
  
  if (size < this->buffer_size_) {
    WriteRaw(this,data,size);
  }
  else {
    Trim(this);
    this->total_bytes_ = size + this->total_bytes_;
    iVar1 = (*this->output_->_vptr_ZeroCopyOutputStream[5])(this->output_,data,(ulong)(uint)size);
    this->had_error_ = (this->had_error_ & 1U) != 0 || (((byte)iVar1 ^ 0xff) & 1) != 0;
  }
  return;
}

Assistant:

void CodedOutputStream::WriteAliasedRaw(const void* data, int size) {
  if (size < buffer_size_
      ) {
    WriteRaw(data, size);
  } else {
    Trim();

    total_bytes_ += size;
    had_error_ |= !output_->WriteAliasedRaw(data, size);
  }
}